

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clagge.c
# Opt level: O1

int clagge_slu(int *m,int *n,int *kl,int *ku,float *d,singlecomplex *a,int *lda,int *iseed,
              singlecomplex *work,int *info)

{
  uint uVar1;
  int *piVar2;
  uint *puVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  uint *puVar8;
  ulong uVar9;
  long lVar10;
  uint *puVar11;
  uint uVar12;
  long lVar13;
  singlecomplex *psVar14;
  double dVar15;
  float fVar16;
  uint local_ac;
  singlecomplex local_a8;
  uint local_a0;
  int i__1;
  uint *local_98;
  int *local_90;
  uint *local_88;
  double local_80;
  singlecomplex *local_78;
  float *local_70;
  uint *local_68;
  singlecomplex *local_60;
  ulong local_58;
  float *local_50;
  ulong local_48;
  singlecomplex *local_40;
  ulong local_38;
  
  iVar5 = *lda;
  uVar9 = (ulong)iVar5;
  *info = 0;
  uVar12 = *m;
  if ((int)uVar12 < 0) {
    iVar4 = -1;
  }
  else if (*n < 0) {
    iVar4 = -2;
  }
  else {
    iVar4 = -3;
    if ((((uint)*kl < uVar12) && (iVar4 = -4, (uint)*ku < (uint)*n)) &&
       (iVar4 = -7, (int)uVar12 <= *lda)) goto LAB_00108508;
  }
  *info = iVar4;
LAB_00108508:
  if (*info < 0) {
    i__1 = -*info;
    input_error("CLAGGE",&i__1);
  }
  else {
    local_48 = ~uVar9;
    local_78 = a + local_48;
    uVar12 = *n;
    uVar7 = (ulong)local_a0;
    local_98 = (uint *)kl;
    local_90 = n;
    local_88 = (uint *)m;
    local_68 = (uint *)ku;
    local_40 = a;
    if (0 < (long)(int)uVar12) {
      local_ac = *m;
      local_58 = (ulong)local_ac;
      local_70 = (float *)CONCAT44(local_70._4_4_,iVar5 + 1);
      local_60 = (singlecomplex *)(local_58 << 3);
      local_80 = (double)(ulong)(local_ac + 1);
      lVar13 = (long)local_80 - 1;
      lVar10 = 0;
      iVar4 = -iVar5;
      i__1 = uVar12;
      local_50 = d;
      do {
        if (0 < (int)local_58) {
          memset(local_78 + ((int)lVar10 * iVar5 + (int)local_70),0,(size_t)local_60);
          lVar6 = 0;
          do {
            lVar6 = lVar6 + 1;
          } while (lVar13 != lVar6);
          uVar7 = (ulong)(uint)((int)lVar6 - iVar4);
        }
        lVar10 = lVar10 + 1;
        iVar4 = iVar4 + -iVar5;
        d = local_50;
      } while (lVar10 != (int)uVar12);
    }
    if ((int)*local_88 < (int)uVar12) {
      uVar12 = *local_88;
    }
    if (0 < (int)uVar12) {
      local_ac = 0;
      uVar7 = 0;
      do {
        local_ac = local_ac + iVar5 + 1;
        local_78[(int)local_ac].r = d[uVar7];
        local_78[(int)local_ac].i = 0.0;
        uVar7 = uVar7 + 1;
      } while (uVar12 != uVar7);
    }
    local_a0 = (uint)uVar7;
    puVar8 = local_98;
    puVar11 = local_68;
    psVar14 = local_78;
    if (0 < (int)uVar12) {
      local_60 = work + 1;
      local_58 = CONCAT44(local_58._4_4_,iVar5 + 1);
      do {
        piVar2 = local_90;
        iVar4 = *local_88 - uVar12;
        clagge_slu::i = uVar12;
        if (iVar4 != 0 && (int)uVar12 <= (int)*local_88) {
          i__1 = iVar4 + 1;
          clarnv_slu(&c__3,iseed,&i__1,work);
          puVar11 = local_88;
          i__1 = (*local_88 - clagge_slu::i) + 1;
          clagge_slu::wn = scnrm2_(&i__1,work,&c__1);
          local_70 = (float *)(double)clagge_slu::wn;
          dVar15 = c_abs(work);
          clagge_slu::wa.r = (float)((double)work->r * ((double)local_70 / dVar15));
          clagge_slu::wa.i = (float)((double)work->i * ((double)local_70 / dVar15));
          if ((clagge_slu::wn != 0.0) ||
             (fVar16 = 0.0, local_a8.r = clagge_slu::wa.r, local_a8.i = clagge_slu::wa.i,
             NAN(clagge_slu::wn))) {
            clagge_slu::wb.r = clagge_slu::wa.r + work->r;
            clagge_slu::wb.i = clagge_slu::wa.i + work->i;
            i__1 = *puVar11 - clagge_slu::i;
            local_a8.r = clagge_slu::wb.r;
            local_a8.i = clagge_slu::wb.i;
            c_div(&local_a8,&c_b2,&clagge_slu::wb);
            cscal_(&i__1,&local_a8,local_60,&c__1);
            work->r = 1.0;
            work->i = 0.0;
            c_div(&local_a8,&clagge_slu::wb,&clagge_slu::wa);
            fVar16 = local_a8.r;
          }
          i__1 = (*puVar11 - clagge_slu::i) + 1;
          local_ac = (*piVar2 - clagge_slu::i) + 1;
          iVar4 = (int)local_58;
          clagge_slu_tau_0 = fVar16;
          cgemv_("Conjugate transpose",&i__1,(integer *)&local_ac,&c_b2,
                 psVar14 + clagge_slu::i * (int)local_58,lda,work,&c__1,&c_b1,work + (int)*puVar11,
                 &c__1);
          psVar14 = local_78;
          i__1 = (*puVar11 - clagge_slu::i) + 1;
          local_ac = (*piVar2 - clagge_slu::i) + 1;
          local_a8.r = -clagge_slu_tau_0;
          local_a8.i = -0.0;
          cgerc_(&i__1,(integer *)&local_ac,&local_a8,work,&c__1,work + (int)*puVar11,&c__1,
                 local_78 + clagge_slu::i * iVar4,lda);
          puVar8 = local_98;
          puVar11 = local_68;
        }
        iVar4 = *piVar2 - clagge_slu::i;
        if (iVar4 != 0 && clagge_slu::i <= *piVar2) {
          i__1 = iVar4 + 1;
          clarnv_slu(&c__3,iseed,&i__1,work);
          i__1 = (*piVar2 - clagge_slu::i) + 1;
          clagge_slu::wn = scnrm2_(&i__1,work,&c__1);
          local_70 = (float *)(double)clagge_slu::wn;
          dVar15 = c_abs(work);
          clagge_slu::wa.r = (float)((double)work->r * ((double)local_70 / dVar15));
          clagge_slu::wa.i = (float)((double)work->i * ((double)local_70 / dVar15));
          if ((clagge_slu::wn != 0.0) ||
             (fVar16 = 0.0, local_a8.r = clagge_slu::wa.r, local_a8.i = clagge_slu::wa.i,
             NAN(clagge_slu::wn))) {
            clagge_slu::wb.r = clagge_slu::wa.r + work->r;
            clagge_slu::wb.i = clagge_slu::wa.i + work->i;
            i__1 = *piVar2 - clagge_slu::i;
            local_a8.r = clagge_slu::wb.r;
            local_a8.i = clagge_slu::wb.i;
            c_div(&local_a8,&c_b2,&clagge_slu::wb);
            cscal_(&i__1,&local_a8,local_60,&c__1);
            work->r = 1.0;
            work->i = 0.0;
            c_div(&local_a8,&clagge_slu::wb,&clagge_slu::wa);
            fVar16 = local_a8.r;
          }
          puVar11 = local_88;
          i__1 = (*local_88 - clagge_slu::i) + 1;
          local_ac = (*piVar2 - clagge_slu::i) + 1;
          iVar4 = (int)local_58;
          clagge_slu_tau_0 = fVar16;
          cgemv_("No transpose",&i__1,(integer *)&local_ac,&c_b2,
                 psVar14 + clagge_slu::i * (int)local_58,lda,work,&c__1,&c_b1,work + *piVar2,&c__1);
          psVar14 = local_78;
          i__1 = (*puVar11 - clagge_slu::i) + 1;
          local_ac = (*piVar2 - clagge_slu::i) + 1;
          local_a8.r = -clagge_slu_tau_0;
          local_a8.i = -0.0;
          cgerc_(&i__1,(integer *)&local_ac,&local_a8,work + *piVar2,&c__1,work,&c__1,
                 local_78 + clagge_slu::i * iVar4,lda);
          puVar8 = local_98;
          puVar11 = local_68;
        }
        uVar12 = clagge_slu::i - 1;
      } while (1 < clagge_slu::i);
    }
    local_a0 = ~*puVar11 + *local_90;
    i__1 = local_a0;
    if ((int)local_a0 < (int)(~*puVar8 + *local_88)) {
      i__1 = ~*puVar8 + *local_88;
    }
    clagge_slu::i = 1;
    if (0 < i__1) {
      local_58 = CONCAT44(local_58._4_4_,iVar5 + 1);
      local_70 = &local_40[local_48].i;
      local_60 = (singlecomplex *)(uVar9 * 8);
      local_38 = uVar9;
      do {
        puVar3 = local_88;
        uVar12 = *puVar8;
        uVar1 = *puVar11;
        iVar5 = (int)uVar9;
        if ((int)uVar1 < (int)uVar12) {
          uVar12 = ~uVar1 + *local_90;
          if ((int)*local_88 <= (int)uVar12) {
            uVar12 = *local_88;
          }
          if (clagge_slu::i <= (int)uVar12) {
            local_ac = (*local_90 - (uVar1 + clagge_slu::i)) + 1;
            clagge_slu::wn =
                 scnrm2_((integer *)&local_ac,
                         psVar14 + (int)((uVar1 + clagge_slu::i) * iVar5 + clagge_slu::i),lda);
            local_80 = (double)clagge_slu::wn;
            dVar15 = c_abs(psVar14 + (int)((*puVar11 + clagge_slu::i) * iVar5 + clagge_slu::i));
            iVar4 = (*puVar11 + clagge_slu::i) * iVar5 + clagge_slu::i;
            clagge_slu::wa.r = (float)((double)psVar14[iVar4].r * (local_80 / dVar15));
            clagge_slu::wa.i = (float)((double)psVar14[iVar4].i * (local_80 / dVar15));
            if ((clagge_slu::wn != 0.0) ||
               (fVar16 = 0.0, local_a8.r = clagge_slu::wa.r, local_a8.i = clagge_slu::wa.i,
               NAN(clagge_slu::wn))) {
              clagge_slu::wb.r = clagge_slu::wa.r + psVar14[iVar4].r;
              clagge_slu::wb.i = clagge_slu::wa.i + psVar14[iVar4].i;
              local_ac = *local_90 - (*puVar11 + clagge_slu::i);
              local_a8.r = clagge_slu::wb.r;
              local_a8.i = clagge_slu::wb.i;
              c_div(&local_a8,&c_b2,&clagge_slu::wb);
              cscal_((integer *)&local_ac,&local_a8,
                     psVar14 + (int)((*puVar11 + clagge_slu::i + 1) * iVar5 + clagge_slu::i),lda);
              local_ac = (*puVar11 + clagge_slu::i) * iVar5 + clagge_slu::i;
              psVar14[(int)local_ac].r = 1.0;
              psVar14[(int)local_ac].i = 0.0;
              c_div(&local_a8,&clagge_slu::wb,&clagge_slu::wa);
              fVar16 = local_a8.r;
            }
            local_ac = (*local_90 - (*puVar11 + clagge_slu::i)) + 1;
            clagge_slu_tau_0 = fVar16;
            clacgv_slu((int *)&local_ac,
                       psVar14 + (int)((*puVar11 + clagge_slu::i) * iVar5 + clagge_slu::i),lda);
            local_ac = *puVar3 - clagge_slu::i;
            local_a0 = (*local_90 - (*puVar11 + clagge_slu::i)) + 1;
            iVar4 = (*puVar11 + clagge_slu::i) * iVar5;
            cgemv_("No transpose",(integer *)&local_ac,(integer *)&local_a0,&c_b2,
                   psVar14 + (clagge_slu::i + iVar4 + 1),lda,psVar14 + (iVar4 + clagge_slu::i),lda,
                   &c_b1,work,&c__1);
            local_ac = *puVar3 - clagge_slu::i;
            local_a0 = (*local_90 - (*puVar11 + clagge_slu::i)) + 1;
            local_a8.r = -clagge_slu_tau_0;
            local_a8.i = -0.0;
            iVar4 = (*puVar11 + clagge_slu::i) * iVar5;
            cgerc_((integer *)&local_ac,(integer *)&local_a0,&local_a8,work,&c__1,
                   psVar14 + (iVar4 + clagge_slu::i),lda,psVar14 + (iVar4 + clagge_slu::i + 1),lda);
            iVar4 = (*puVar11 + clagge_slu::i) * iVar5 + clagge_slu::i;
            local_a8.r = -clagge_slu::wa.r;
            local_a8.i = -clagge_slu::wa.i;
            psVar14[iVar4].r = local_a8.r;
            psVar14[iVar4].i = local_a8.i;
            puVar8 = local_98;
          }
          iVar4 = ~*puVar8 + *puVar3;
          if (*local_90 <= iVar4) {
            iVar4 = *local_90;
          }
          if (clagge_slu::i <= iVar4) {
            iVar4 = *puVar8 + clagge_slu::i;
            local_ac = (*puVar3 - iVar4) + 1;
            clagge_slu::wn =
                 scnrm2_((integer *)&local_ac,psVar14 + (clagge_slu::i * iVar5 + iVar4),&c__1);
            local_80 = (double)clagge_slu::wn;
            dVar15 = c_abs(psVar14 + (int)(clagge_slu::i * iVar5 + *local_98 + clagge_slu::i));
            puVar11 = local_88;
            iVar4 = clagge_slu::i * iVar5 + *local_98 + clagge_slu::i;
            clagge_slu::wa.r = (float)((double)psVar14[iVar4].r * (local_80 / dVar15));
            clagge_slu::wa.i = (float)((double)psVar14[iVar4].i * (local_80 / dVar15));
            if ((clagge_slu::wn != 0.0) ||
               (fVar16 = 0.0, local_a8.r = clagge_slu::wa.r, local_a8.i = clagge_slu::wa.i,
               NAN(clagge_slu::wn))) {
              clagge_slu::wb.r = clagge_slu::wa.r + psVar14[iVar4].r;
              clagge_slu::wb.i = clagge_slu::wa.i + psVar14[iVar4].i;
              local_ac = *local_88 - (*local_98 + clagge_slu::i);
              local_a8.r = clagge_slu::wb.r;
              local_a8.i = clagge_slu::wb.i;
              c_div(&local_a8,&c_b2,&clagge_slu::wb);
              cscal_((integer *)&local_ac,&local_a8,
                     psVar14 + (int)(clagge_slu::i + *local_98 + clagge_slu::i * iVar5 + 1),&c__1);
              local_ac = clagge_slu::i * iVar5 + *local_98 + clagge_slu::i;
              psVar14[(int)local_ac].r = 1.0;
              psVar14[(int)local_ac].i = 0.0;
              c_div(&local_a8,&clagge_slu::wb,&clagge_slu::wa);
              fVar16 = local_a8.r;
            }
            piVar2 = local_90;
            iVar4 = *local_98 + clagge_slu::i;
            local_ac = (*puVar11 - iVar4) + 1;
            local_a0 = *local_90 - clagge_slu::i;
            clagge_slu_tau_0 = fVar16;
            cgemv_("Conjugate transpose",(integer *)&local_ac,(integer *)&local_a0,&c_b2,
                   psVar14 + ((clagge_slu::i + 1) * iVar5 + iVar4),lda,
                   psVar14 + (clagge_slu::i * iVar5 + iVar4),&c__1,&c_b1,work,&c__1);
            iVar4 = *local_98 + clagge_slu::i;
            local_ac = (*puVar11 - iVar4) + 1;
            local_a0 = *piVar2 - clagge_slu::i;
            local_a8.r = -clagge_slu_tau_0;
            local_a8.i = -0.0;
            cgerc_((integer *)&local_ac,(integer *)&local_a0,&local_a8,
                   psVar14 + (clagge_slu::i * iVar5 + iVar4),&c__1,work,&c__1,
                   psVar14 + ((clagge_slu::i + 1) * iVar5 + iVar4),lda);
            iVar5 = clagge_slu::i * iVar5 + *local_98 + clagge_slu::i;
            puVar11 = local_68;
LAB_00109925:
            local_a8.r = -clagge_slu::wa.r;
            local_a8.i = -clagge_slu::wa.i;
            psVar14[iVar5].r = local_a8.r;
            psVar14[iVar5].i = local_a8.i;
            puVar8 = local_98;
          }
        }
        else {
          iVar4 = ~uVar12 + *local_88;
          if (*local_90 <= iVar4) {
            iVar4 = *local_90;
          }
          puVar11 = local_88;
          if (clagge_slu::i <= iVar4) {
            local_ac = (*local_88 - (uVar12 + clagge_slu::i)) + 1;
            clagge_slu::wn =
                 scnrm2_((integer *)&local_ac,
                         psVar14 + (int)(clagge_slu::i * iVar5 + uVar12 + clagge_slu::i),&c__1);
            local_80 = (double)clagge_slu::wn;
            dVar15 = c_abs(psVar14 + (int)(clagge_slu::i * iVar5 + *local_98 + clagge_slu::i));
            iVar4 = clagge_slu::i * iVar5 + *local_98 + clagge_slu::i;
            clagge_slu::wa.r = (float)((double)psVar14[iVar4].r * (local_80 / dVar15));
            clagge_slu::wa.i = (float)((double)psVar14[iVar4].i * (local_80 / dVar15));
            if ((clagge_slu::wn != 0.0) ||
               (fVar16 = 0.0, local_a8.r = clagge_slu::wa.r, local_a8.i = clagge_slu::wa.i,
               NAN(clagge_slu::wn))) {
              clagge_slu::wb.r = clagge_slu::wa.r + psVar14[iVar4].r;
              clagge_slu::wb.i = clagge_slu::wa.i + psVar14[iVar4].i;
              local_ac = *local_88 - (*local_98 + clagge_slu::i);
              local_a8.r = clagge_slu::wb.r;
              local_a8.i = clagge_slu::wb.i;
              c_div(&local_a8,&c_b2,&clagge_slu::wb);
              cscal_((integer *)&local_ac,&local_a8,
                     psVar14 + (int)(clagge_slu::i + *local_98 + clagge_slu::i * iVar5 + 1),&c__1);
              local_ac = clagge_slu::i * iVar5 + *local_98 + clagge_slu::i;
              psVar14[(int)local_ac].r = 1.0;
              psVar14[(int)local_ac].i = 0.0;
              c_div(&local_a8,&clagge_slu::wb,&clagge_slu::wa);
              fVar16 = local_a8.r;
            }
            puVar11 = local_88;
            piVar2 = local_90;
            iVar4 = *local_98 + clagge_slu::i;
            local_ac = (*local_88 - iVar4) + 1;
            local_a0 = *local_90 - clagge_slu::i;
            clagge_slu_tau_0 = fVar16;
            cgemv_("Conjugate transpose",(integer *)&local_ac,(integer *)&local_a0,&c_b2,
                   psVar14 + ((clagge_slu::i + 1) * iVar5 + iVar4),lda,
                   psVar14 + (clagge_slu::i * iVar5 + iVar4),&c__1,&c_b1,work,&c__1);
            iVar4 = *local_98 + clagge_slu::i;
            local_ac = (*puVar11 - iVar4) + 1;
            local_a0 = *piVar2 - clagge_slu::i;
            local_a8.r = -clagge_slu_tau_0;
            local_a8.i = -0.0;
            cgerc_((integer *)&local_ac,(integer *)&local_a0,&local_a8,
                   psVar14 + (clagge_slu::i * iVar5 + iVar4),&c__1,work,&c__1,
                   psVar14 + ((clagge_slu::i + 1) * iVar5 + iVar4),lda);
            iVar4 = clagge_slu::i * iVar5 + *local_98 + clagge_slu::i;
            local_a8.r = -clagge_slu::wa.r;
            local_a8.i = -clagge_slu::wa.i;
            psVar14[iVar4].r = local_a8.r;
            psVar14[iVar4].i = local_a8.i;
            puVar8 = local_98;
          }
          puVar3 = local_68;
          uVar12 = ~*local_68 + *local_90;
          if ((int)*puVar11 <= (int)uVar12) {
            uVar12 = *puVar11;
          }
          puVar11 = local_68;
          if (clagge_slu::i <= (int)uVar12) {
            iVar4 = *local_68 + clagge_slu::i;
            local_ac = (*local_90 - iVar4) + 1;
            clagge_slu::wn =
                 scnrm2_((integer *)&local_ac,psVar14 + (iVar4 * iVar5 + clagge_slu::i),lda);
            local_80 = (double)clagge_slu::wn;
            dVar15 = c_abs(psVar14 + (int)((*puVar3 + clagge_slu::i) * iVar5 + clagge_slu::i));
            iVar4 = (*puVar3 + clagge_slu::i) * iVar5 + clagge_slu::i;
            clagge_slu::wa.r = (float)((double)psVar14[iVar4].r * (local_80 / dVar15));
            clagge_slu::wa.i = (float)((double)psVar14[iVar4].i * (local_80 / dVar15));
            if ((clagge_slu::wn != 0.0) ||
               (fVar16 = 0.0, local_a8.r = clagge_slu::wa.r, local_a8.i = clagge_slu::wa.i,
               NAN(clagge_slu::wn))) {
              clagge_slu::wb.r = clagge_slu::wa.r + psVar14[iVar4].r;
              clagge_slu::wb.i = clagge_slu::wa.i + psVar14[iVar4].i;
              local_ac = *local_90 - (*puVar3 + clagge_slu::i);
              local_a8.r = clagge_slu::wb.r;
              local_a8.i = clagge_slu::wb.i;
              c_div(&local_a8,&c_b2,&clagge_slu::wb);
              cscal_((integer *)&local_ac,&local_a8,
                     psVar14 + (int)((*puVar3 + clagge_slu::i + 1) * iVar5 + clagge_slu::i),lda);
              local_ac = (*puVar3 + clagge_slu::i) * iVar5 + clagge_slu::i;
              psVar14[(int)local_ac].r = 1.0;
              psVar14[(int)local_ac].i = 0.0;
              c_div(&local_a8,&clagge_slu::wb,&clagge_slu::wa);
              fVar16 = local_a8.r;
            }
            piVar2 = local_90;
            local_ac = (*local_90 - (*puVar3 + clagge_slu::i)) + 1;
            clagge_slu_tau_0 = fVar16;
            clacgv_slu((int *)&local_ac,
                       psVar14 + (int)((*puVar3 + clagge_slu::i) * iVar5 + clagge_slu::i),lda);
            puVar8 = local_88;
            local_ac = *local_88 - clagge_slu::i;
            local_a0 = (*piVar2 - (*local_68 + clagge_slu::i)) + 1;
            iVar4 = (*local_68 + clagge_slu::i) * iVar5;
            cgemv_("No transpose",(integer *)&local_ac,(integer *)&local_a0,&c_b2,
                   psVar14 + (clagge_slu::i + iVar4 + 1),lda,psVar14 + (iVar4 + clagge_slu::i),lda,
                   &c_b1,work,&c__1);
            puVar11 = local_68;
            local_ac = *puVar8 - clagge_slu::i;
            local_a0 = (*local_90 - (*local_68 + clagge_slu::i)) + 1;
            local_a8.r = -clagge_slu_tau_0;
            local_a8.i = -0.0;
            iVar4 = (*local_68 + clagge_slu::i) * iVar5;
            cgerc_((integer *)&local_ac,(integer *)&local_a0,&local_a8,work,&c__1,
                   psVar14 + (iVar4 + clagge_slu::i),lda,psVar14 + (iVar4 + clagge_slu::i + 1),lda);
            iVar5 = (*puVar11 + clagge_slu::i) * iVar5 + clagge_slu::i;
            goto LAB_00109925;
          }
        }
        iVar5 = clagge_slu::i;
        local_ac = *local_88;
        lVar10 = (long)(int)local_ac;
        uVar12 = *puVar8;
        lVar13 = (long)clagge_slu::i;
        if ((int)(clagge_slu::i + uVar12) < (int)local_ac) {
          iVar4 = (int)local_58;
          memset(local_78 + (int)((int)local_58 * clagge_slu::i + uVar12 + 1),0,
                 (ulong)((~uVar12 + local_ac) - clagge_slu::i) * 8 + 8);
          local_a0 = iVar4 * iVar5 + uVar12;
          lVar6 = (int)uVar12 + lVar13;
          do {
            local_a0 = local_a0 + 1;
            lVar6 = lVar6 + 1;
            uVar9 = local_38;
          } while (lVar6 < lVar10);
        }
        iVar4 = *local_90;
        uVar12 = *puVar11;
        if ((int)(uVar12 + iVar5) < iVar4) {
          lVar10 = (int)uVar12 + lVar13;
          local_a0 = (uVar12 + iVar5) * (int)uVar9 + iVar5;
          lVar13 = ((int)uVar12 + lVar13 + 1) * (long)local_60 + lVar13 * 8 + (long)local_70;
          do {
            *(undefined8 *)(lVar13 + -4) = 0;
            lVar10 = lVar10 + 1;
            local_a0 = local_a0 + (int)uVar9;
            lVar13 = lVar13 + (long)local_60;
          } while (lVar10 < iVar4);
        }
        clagge_slu::i = iVar5 + 1;
        psVar14 = local_78;
      } while (iVar5 < i__1);
    }
  }
  return 0;
}

Assistant:

int clagge_slu(int *m, int *n, int *kl, int *ku,
	 float *d, singlecomplex *a, int *lda, int *iseed, singlecomplex *work,
	int *info)
{
    /* System generated locals */
    int a_dim1, a_offset, i__1, i__2, i__3;
    double d__1;
    singlecomplex q__1;

    /* Local variables */
    static int i, j;
    extern /* Subroutine */ int cgerc_(int *, int *, singlecomplex *,
	    singlecomplex *, int *, singlecomplex *, int *, singlecomplex *, int *),
	cscal_(int *, singlecomplex *, singlecomplex *, int *); 
    extern float scnrm2_(int *, singlecomplex *, int *);
    static singlecomplex wa, wb;
    extern /* Subroutine */ int clacgv_slu(int *, singlecomplex *, int *);
    static float wn;
    extern /* Subroutine */ int clarnv_slu(int *, int *, int *, singlecomplex *);
    extern int input_error(char *, int *);
    static singlecomplex tau;


/*  -- LAPACK auxiliary test routine (version 2.0) --   
       Univ. of Tennessee, Univ. of California Berkeley, NAG Ltd.,   
       Courant Institute, Argonne National Lab, and Rice University   
       September 30, 1994   


    Purpose   
    =======   

    CLAGGE generates a complex general m by n matrix A, by pre- and post- 
  
    multiplying a real diagonal matrix D with random unitary matrices:   
    A = U*D*V. The lower and upper bandwidths may then be reduced to   
    kl and ku by additional unitary transformations.   

    Arguments   
    =========   

    M       (input) INTEGER   
            The number of rows of the matrix A.  M >= 0.   

    N       (input) INTEGER   
            The number of columns of the matrix A.  N >= 0.   

    KL      (input) INTEGER   
            The number of nonzero subdiagonals within the band of A.   
            0 <= KL <= M-1.   

    KU      (input) INTEGER   
            The number of nonzero superdiagonals within the band of A.   
            0 <= KU <= N-1.   

    D       (input) REAL array, dimension (min(M,N))   
            The diagonal elements of the diagonal matrix D.   

    A       (output) COMPLEX array, dimension (LDA,N)   
            The generated m by n matrix A.   

    LDA     (input) INTEGER   
            The leading dimension of the array A.  LDA >= M.   

    ISEED   (input/output) INTEGER array, dimension (4)   
            On entry, the seed of the random number generator; the array 
  
            elements must be between 0 and 4095, and ISEED(4) must be   
            odd.   
            On exit, the seed is updated.   

    WORK    (workspace) COMPLEX array, dimension (M+N)   

    INFO    (output) INTEGER   
            = 0: successful exit   
            < 0: if INFO = -i, the i-th argument had an illegal value   

    ===================================================================== 
  


       Test the input arguments   

       Parameter adjustments */
    --d;
    a_dim1 = *lda;
    a_offset = a_dim1 + 1;
    a -= a_offset;
    --iseed;
    --work;

    /* Function Body */
    *info = 0;
    if (*m < 0) {
	*info = -1;
    } else if (*n < 0) {
	*info = -2;
    } else if (*kl < 0 || *kl > *m - 1) {
	*info = -3;
    } else if (*ku < 0 || *ku > *n - 1) {
	*info = -4;
    } else if (*lda < SUPERLU_MAX(1,*m)) {
	*info = -7;
    }
    if (*info < 0) {
	i__1 = -(*info);
	input_error("CLAGGE", &i__1);
	return 0;
    }

/*     initialize A to diagonal matrix */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	i__2 = *m;
	for (i = 1; i <= i__2; ++i) {
	    i__3 = i + j * a_dim1;
	    a[i__3].r = 0.f, a[i__3].i = 0.f;
/* L10: */
	}
/* L20: */
    }
    i__1 = SUPERLU_MIN(*m,*n);
    for (i = 1; i <= i__1; ++i) {
	i__2 = i + i * a_dim1;
	i__3 = i;
	a[i__2].r = d[i__3], a[i__2].i = 0.f;
/* L30: */
    }

/*     pre- and post-multiply A by random unitary matrices */

    for (i = SUPERLU_MIN(*m,*n); i >= 1; --i) {
	if (i < *m) {

/*           generate random reflection */

	    i__1 = *m - i + 1;
	    clarnv_slu(&c__3, &iseed[1], &i__1, &work[1]);
	    i__1 = *m - i + 1;
	    wn = scnrm2_(&i__1, &work[1], &c__1);
	    d__1 = wn / c_abs(&work[1]);
	    q__1.r = d__1 * work[1].r, q__1.i = d__1 * work[1].i;
	    wa.r = q__1.r, wa.i = q__1.i;
	    if (wn == 0.f) {
		tau.r = 0.f, tau.i = 0.f;
	    } else {
		q__1.r = work[1].r + wa.r, q__1.i = work[1].i + wa.i;
		wb.r = q__1.r, wb.i = q__1.i;
		i__1 = *m - i;
		c_div(&q__1, &c_b2, &wb);
		cscal_(&i__1, &q__1, &work[2], &c__1);
		work[1].r = 1.f, work[1].i = 0.f;
		c_div(&q__1, &wb, &wa);
		d__1 = q__1.r;
		tau.r = d__1, tau.i = 0.f;
	    }

/*           multiply A(i:m,i:n) by random reflection from the lef
t */

	    i__1 = *m - i + 1;
	    i__2 = *n - i + 1;
	    cgemv_("Conjugate transpose", &i__1, &i__2, &c_b2, &a[i + i * 
		    a_dim1], lda, &work[1], &c__1, &c_b1, &work[*m + 1], &
		    c__1);
	    i__1 = *m - i + 1;
	    i__2 = *n - i + 1;
	    q__1.r = -(double)tau.r, q__1.i = -(double)tau.i;
	    cgerc_(&i__1, &i__2, &q__1, &work[1], &c__1, &work[*m + 1], &c__1,
		     &a[i + i * a_dim1], lda);
	}
	if (i < *n) {

/*           generate random reflection */

	    i__1 = *n - i + 1;
	    clarnv_slu(&c__3, &iseed[1], &i__1, &work[1]);
	    i__1 = *n - i + 1;
	    wn = scnrm2_(&i__1, &work[1], &c__1);
	    d__1 = wn / c_abs(&work[1]);
	    q__1.r = d__1 * work[1].r, q__1.i = d__1 * work[1].i;
	    wa.r = q__1.r, wa.i = q__1.i;
	    if (wn == 0.f) {
		tau.r = 0.f, tau.i = 0.f;
	    } else {
		q__1.r = work[1].r + wa.r, q__1.i = work[1].i + wa.i;
		wb.r = q__1.r, wb.i = q__1.i;
		i__1 = *n - i;
		c_div(&q__1, &c_b2, &wb);
		cscal_(&i__1, &q__1, &work[2], &c__1);
		work[1].r = 1.f, work[1].i = 0.f;
		c_div(&q__1, &wb, &wa);
		d__1 = q__1.r;
		tau.r = d__1, tau.i = 0.f;
	    }

/*           multiply A(i:m,i:n) by random reflection from the rig
ht */

	    i__1 = *m - i + 1;
	    i__2 = *n - i + 1;
	    cgemv_("No transpose", &i__1, &i__2, &c_b2, &a[i + i * a_dim1], 
		    lda, &work[1], &c__1, &c_b1, &work[*n + 1], &c__1);
	    i__1 = *m - i + 1;
	    i__2 = *n - i + 1;
	    q__1.r = -(double)tau.r, q__1.i = -(double)tau.i;
	    cgerc_(&i__1, &i__2, &q__1, &work[*n + 1], &c__1, &work[1], &c__1,
		     &a[i + i * a_dim1], lda);
	}
/* L40: */
    }

/*     Reduce number of subdiagonals to KL and number of superdiagonals   
       to KU   

   Computing MAX */
    i__2 = *m - 1 - *kl, i__3 = *n - 1 - *ku;
    i__1 = SUPERLU_MAX(i__2,i__3);
    for (i = 1; i <= i__1; ++i) {
	if (*kl <= *ku) {

/*           annihilate subdiagonal elements first (necessary if K
L = 0)   

   Computing MIN */
	    i__2 = *m - 1 - *kl;
	    if (i <= SUPERLU_MIN(i__2,*n)) {

/*              generate reflection to annihilate A(kl+i+1:m,i
) */

		i__2 = *m - *kl - i + 1;
		wn = scnrm2_(&i__2, &a[*kl + i + i * a_dim1], &c__1);
		d__1 = wn / c_abs(&a[*kl + i + i * a_dim1]);
		i__2 = *kl + i + i * a_dim1;
		q__1.r = d__1 * a[i__2].r, q__1.i = d__1 * a[i__2].i;
		wa.r = q__1.r, wa.i = q__1.i;
		if (wn == 0.f) {
		    tau.r = 0.f, tau.i = 0.f;
		} else {
		    i__2 = *kl + i + i * a_dim1;
		    q__1.r = a[i__2].r + wa.r, q__1.i = a[i__2].i + wa.i;
		    wb.r = q__1.r, wb.i = q__1.i;
		    i__2 = *m - *kl - i;
		    c_div(&q__1, &c_b2, &wb);
		    cscal_(&i__2, &q__1, &a[*kl + i + 1 + i * a_dim1], &c__1);
		    i__2 = *kl + i + i * a_dim1;
		    a[i__2].r = 1.f, a[i__2].i = 0.f;
		    c_div(&q__1, &wb, &wa);
		    d__1 = q__1.r;
		    tau.r = d__1, tau.i = 0.f;
		}

/*              apply reflection to A(kl+i:m,i+1:n) from the l
eft */

		i__2 = *m - *kl - i + 1;
		i__3 = *n - i;
		cgemv_("Conjugate transpose", &i__2, &i__3, &c_b2, &a[*kl + i 
			+ (i + 1) * a_dim1], lda, &a[*kl + i + i * a_dim1], &
			c__1, &c_b1, &work[1], &c__1);
		i__2 = *m - *kl - i + 1;
		i__3 = *n - i;
		q__1.r = -(double)tau.r, q__1.i = -(double)tau.i;
		cgerc_(&i__2, &i__3, &q__1, &a[*kl + i + i * a_dim1], &c__1, &
			work[1], &c__1, &a[*kl + i + (i + 1) * a_dim1], lda);
		i__2 = *kl + i + i * a_dim1;
		q__1.r = -(double)wa.r, q__1.i = -(double)wa.i;
		a[i__2].r = q__1.r, a[i__2].i = q__1.i;
	    }

/* Computing MIN */
	    i__2 = *n - 1 - *ku;
	    if (i <= SUPERLU_MIN(i__2,*m)) {

/*              generate reflection to annihilate A(i,ku+i+1:n
) */

		i__2 = *n - *ku - i + 1;
		wn = scnrm2_(&i__2, &a[i + (*ku + i) * a_dim1], lda);
		d__1 = wn / c_abs(&a[i + (*ku + i) * a_dim1]);
		i__2 = i + (*ku + i) * a_dim1;
		q__1.r = d__1 * a[i__2].r, q__1.i = d__1 * a[i__2].i;
		wa.r = q__1.r, wa.i = q__1.i;
		if (wn == 0.f) {
		    tau.r = 0.f, tau.i = 0.f;
		} else {
		    i__2 = i + (*ku + i) * a_dim1;
		    q__1.r = a[i__2].r + wa.r, q__1.i = a[i__2].i + wa.i;
		    wb.r = q__1.r, wb.i = q__1.i;
		    i__2 = *n - *ku - i;
		    c_div(&q__1, &c_b2, &wb);
		    cscal_(&i__2, &q__1, &a[i + (*ku + i + 1) * a_dim1], lda);
		    i__2 = i + (*ku + i) * a_dim1;
		    a[i__2].r = 1.f, a[i__2].i = 0.f;
		    c_div(&q__1, &wb, &wa);
		    d__1 = q__1.r;
		    tau.r = d__1, tau.i = 0.f;
		}

/*              apply reflection to A(i+1:m,ku+i:n) from the r
ight */

		i__2 = *n - *ku - i + 1;
		clacgv_slu(&i__2, &a[i + (*ku + i) * a_dim1], lda);
		i__2 = *m - i;
		i__3 = *n - *ku - i + 1;
		cgemv_("No transpose", &i__2, &i__3, &c_b2, &a[i + 1 + (*ku + 
			i) * a_dim1], lda, &a[i + (*ku + i) * a_dim1], lda, &
			c_b1, &work[1], &c__1);
		i__2 = *m - i;
		i__3 = *n - *ku - i + 1;
		q__1.r = -(double)tau.r, q__1.i = -(double)tau.i;
		cgerc_(&i__2, &i__3, &q__1, &work[1], &c__1, &a[i + (*ku + i) 
			* a_dim1], lda, &a[i + 1 + (*ku + i) * a_dim1], lda);
		i__2 = i + (*ku + i) * a_dim1;
		q__1.r = -(double)wa.r, q__1.i = -(double)wa.i;
		a[i__2].r = q__1.r, a[i__2].i = q__1.i;
	    }
	} else {

/*           annihilate superdiagonal elements first (necessary if
   
             KU = 0)   

   Computing MIN */
	    i__2 = *n - 1 - *ku;
	    if (i <= SUPERLU_MIN(i__2,*m)) {

/*              generate reflection to annihilate A(i,ku+i+1:n
) */

		i__2 = *n - *ku - i + 1;
		wn = scnrm2_(&i__2, &a[i + (*ku + i) * a_dim1], lda);
		d__1 = wn / c_abs(&a[i + (*ku + i) * a_dim1]);
		i__2 = i + (*ku + i) * a_dim1;
		q__1.r = d__1 * a[i__2].r, q__1.i = d__1 * a[i__2].i;
		wa.r = q__1.r, wa.i = q__1.i;
		if (wn == 0.f) {
		    tau.r = 0.f, tau.i = 0.f;
		} else {
		    i__2 = i + (*ku + i) * a_dim1;
		    q__1.r = a[i__2].r + wa.r, q__1.i = a[i__2].i + wa.i;
		    wb.r = q__1.r, wb.i = q__1.i;
		    i__2 = *n - *ku - i;
		    c_div(&q__1, &c_b2, &wb);
		    cscal_(&i__2, &q__1, &a[i + (*ku + i + 1) * a_dim1], lda);
		    i__2 = i + (*ku + i) * a_dim1;
		    a[i__2].r = 1.f, a[i__2].i = 0.f;
		    c_div(&q__1, &wb, &wa);
		    d__1 = q__1.r;
		    tau.r = d__1, tau.i = 0.f;
		}

/*              apply reflection to A(i+1:m,ku+i:n) from the r
ight */

		i__2 = *n - *ku - i + 1;
		clacgv_slu(&i__2, &a[i + (*ku + i) * a_dim1], lda);
		i__2 = *m - i;
		i__3 = *n - *ku - i + 1;
		cgemv_("No transpose", &i__2, &i__3, &c_b2, &a[i + 1 + (*ku + 
			i) * a_dim1], lda, &a[i + (*ku + i) * a_dim1], lda, &
			c_b1, &work[1], &c__1);
		i__2 = *m - i;
		i__3 = *n - *ku - i + 1;
		q__1.r = -(double)tau.r, q__1.i = -(double)tau.i;
		cgerc_(&i__2, &i__3, &q__1, &work[1], &c__1, &a[i + (*ku + i) 
			* a_dim1], lda, &a[i + 1 + (*ku + i) * a_dim1], lda);
		i__2 = i + (*ku + i) * a_dim1;
		q__1.r = -(double)wa.r, q__1.i = -(double)wa.i;
		a[i__2].r = q__1.r, a[i__2].i = q__1.i;
	    }

/* Computing MIN */
	    i__2 = *m - 1 - *kl;
	    if (i <= SUPERLU_MIN(i__2,*n)) {

/*              generate reflection to annihilate A(kl+i+1:m,i
) */

		i__2 = *m - *kl - i + 1;
		wn = scnrm2_(&i__2, &a[*kl + i + i * a_dim1], &c__1);
		d__1 = wn / c_abs(&a[*kl + i + i * a_dim1]);
		i__2 = *kl + i + i * a_dim1;
		q__1.r = d__1 * a[i__2].r, q__1.i = d__1 * a[i__2].i;
		wa.r = q__1.r, wa.i = q__1.i;
		if (wn == 0.f) {
		    tau.r = 0.f, tau.i = 0.f;
		} else {
		    i__2 = *kl + i + i * a_dim1;
		    q__1.r = a[i__2].r + wa.r, q__1.i = a[i__2].i + wa.i;
		    wb.r = q__1.r, wb.i = q__1.i;
		    i__2 = *m - *kl - i;
		    c_div(&q__1, &c_b2, &wb);
		    cscal_(&i__2, &q__1, &a[*kl + i + 1 + i * a_dim1], &c__1);
		    i__2 = *kl + i + i * a_dim1;
		    a[i__2].r = 1.f, a[i__2].i = 0.f;
		    c_div(&q__1, &wb, &wa);
		    d__1 = q__1.r;
		    tau.r = d__1, tau.i = 0.f;
		}

/*              apply reflection to A(kl+i:m,i+1:n) from the l
eft */

		i__2 = *m - *kl - i + 1;
		i__3 = *n - i;
		cgemv_("Conjugate transpose", &i__2, &i__3, &c_b2, &a[*kl + i 
			+ (i + 1) * a_dim1], lda, &a[*kl + i + i * a_dim1], &
			c__1, &c_b1, &work[1], &c__1);
		i__2 = *m - *kl - i + 1;
		i__3 = *n - i;
		q__1.r = -(double)tau.r, q__1.i = -(double)tau.i;
		cgerc_(&i__2, &i__3, &q__1, &a[*kl + i + i * a_dim1], &c__1, &
			work[1], &c__1, &a[*kl + i + (i + 1) * a_dim1], lda);
		i__2 = *kl + i + i * a_dim1;
		q__1.r = -(double)wa.r, q__1.i = -(double)wa.i;
		a[i__2].r = q__1.r, a[i__2].i = q__1.i;
	    }
	}

	i__2 = *m;
	for (j = *kl + i + 1; j <= i__2; ++j) {
	    i__3 = j + i * a_dim1;
	    a[i__3].r = 0.f, a[i__3].i = 0.f;
/* L50: */
	}

	i__2 = *n;
	for (j = *ku + i + 1; j <= i__2; ++j) {
	    i__3 = i + j * a_dim1;
	    a[i__3].r = 0.f, a[i__3].i = 0.f;
/* L60: */
	}
/* L70: */
    }
    return 0;

/*     End of CLAGGE */

}